

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool NavScoreItem(ImGuiNavMoveResult *result,ImRect cand)

{
  ImGuiNavLayer IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImRect *pIVar7;
  uint uVar8;
  ImVec2 *pIVar9;
  ImVec2 *pIVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  float fVar21;
  ImVec2 local_18;
  ImVec2 local_10;
  
  pIVar5 = GImGui;
  IVar14 = cand.Max;
  local_10 = cand.Min;
  fVar13 = cand.Min.x;
  pIVar9 = &local_18;
  pIVar3 = GImGui->CurrentWindow;
  IVar1 = GImGui->NavLayer;
  if (IVar1 != (pIVar3->DC).NavLayerCurrent) {
    return false;
  }
  fVar15 = cand.Min.y;
  fVar18 = cand.Max.x;
  fVar12 = cand.Max.y;
  GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
  pIVar4 = pIVar5->NavWindow;
  local_18 = IVar14;
  if (pIVar3->ParentWindow == pIVar4) {
    if (((uint)(pIVar4->Flags | pIVar3->Flags) >> 0x17 & 1) == 0) {
      __assert_fail("(window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1cd3,"bool NavScoreItem(ImGuiNavMoveResult *, ImRect)");
    }
    fVar19 = (pIVar3->ClipRect).Min.x;
    if (fVar13 < fVar19) {
      return false;
    }
    fVar16 = (pIVar3->ClipRect).Min.y;
    if (fVar15 < fVar16) {
      return false;
    }
    if ((pIVar3->ClipRect).Max.x < fVar18) {
      return false;
    }
    if ((pIVar3->ClipRect).Max.y < fVar12) {
      return false;
    }
    IVar20 = (pIVar3->ClipRect).Max;
    fVar21 = IVar20.x;
    fVar17 = fVar16;
    if ((fVar16 <= fVar15) && (fVar17 = IVar20.y, fVar15 <= IVar20.y)) {
      fVar17 = fVar15;
    }
    fVar15 = fVar21;
    if (fVar13 <= fVar21) {
      fVar15 = fVar13;
    }
    fVar13 = (float)(-(uint)(fVar13 < fVar19) & (uint)fVar19 |
                    ~-(uint)(fVar13 < fVar19) & (uint)fVar15);
    local_10.y = fVar17;
    local_10.x = fVar13;
    if ((fVar16 <= fVar12) && (fVar16 = IVar20.y, fVar12 <= IVar20.y)) {
      fVar16 = fVar12;
    }
    if (fVar18 <= fVar21) {
      IVar20.x = fVar18;
    }
    fVar12 = (float)(-(uint)(fVar18 < fVar19) & (uint)fVar19 |
                    ~-(uint)(fVar18 < fVar19) & (uint)IVar20.x);
    IVar14.y = 0.0;
    IVar14.x = fVar12;
    local_18.y = fVar16;
    local_18.x = fVar12;
    fVar12 = fVar16;
    fVar15 = fVar17;
  }
  fVar18 = IVar14.x;
  if ((uint)pIVar5->NavMoveClipDir < 2) {
    pIVar9 = (ImVec2 *)&local_18.y;
    pIVar10 = (ImVec2 *)&local_10.y;
    lVar11 = 0xc;
    pIVar7 = (ImRect *)&(pIVar3->ClipRect).Min.y;
    fVar13 = fVar15;
    fVar18 = fVar12;
  }
  else {
    pIVar10 = &local_10;
    lVar11 = 8;
    pIVar7 = &pIVar3->ClipRect;
  }
  fVar12 = (pIVar7->Min).x;
  fVar15 = *(float *)((long)&(pIVar3->ClipRect).Min.x + lVar11);
  fVar19 = fVar15;
  if (fVar13 <= fVar15) {
    fVar19 = fVar13;
  }
  pIVar10->x = (float)(-(uint)(fVar13 < fVar12) & (uint)fVar12 |
                      ~-(uint)(fVar13 < fVar12) & (uint)fVar19);
  if (fVar18 <= fVar15) {
    fVar15 = fVar18;
  }
  *(uint *)pIVar9 =
       -(uint)(fVar18 < fVar12) & (uint)fVar12 | ~-(uint)(fVar18 < fVar12) & (uint)fVar15;
  fVar13 = (pIVar5->NavScoringRectScreen).Min.x;
  fVar12 = (pIVar5->NavScoringRectScreen).Max.x;
  if (fVar13 <= local_18.x) {
    fVar15 = 0.0;
    if (fVar12 < local_10.x) {
      fVar15 = local_10.x - fVar12;
    }
  }
  else {
    fVar15 = local_18.x - fVar13;
  }
  fVar18 = (pIVar5->NavScoringRectScreen).Min.y;
  fVar19 = (pIVar5->NavScoringRectScreen).Max.y;
  fVar21 = fVar19 - fVar18;
  fVar16 = (local_18.y - local_10.y) * 0.8 + local_10.y;
  fVar17 = fVar21 * 0.2 + fVar18;
  if (fVar17 <= fVar16) {
    fVar16 = (local_18.y - local_10.y) * 0.2 + local_10.y;
    fVar17 = fVar21 * 0.8 + fVar18;
    if (fVar17 < fVar16) {
      fVar16 = fVar16 - fVar17;
      goto LAB_001308de;
    }
    fVar16 = 0.0;
    bVar6 = false;
  }
  else {
    fVar16 = fVar16 - fVar17;
LAB_001308de:
    bVar6 = fVar16 != 0.0;
    if (((fVar15 != 0.0) || (NAN(fVar15))) && ((fVar16 != 0.0 || (NAN(fVar16))))) {
      fVar15 = fVar15 / 1000.0 + *(float *)(&DAT_00196db8 + (ulong)(0.0 < fVar15) * 4);
      bVar6 = true;
    }
  }
  fVar12 = (local_10.x + local_18.x) - (fVar13 + fVar12);
  fVar13 = (local_10.y + local_18.y) - (fVar18 + fVar19);
  fVar18 = ABS(fVar16) + ABS(fVar15);
  fVar19 = ABS(fVar12) + ABS(fVar13);
  if (bVar6) {
LAB_001309a1:
    fVar17 = fVar18;
    uVar8 = (uint)(0.0 < fVar15);
    fVar13 = fVar16;
    fVar12 = fVar15;
    if (ABS(fVar15) <= ABS(fVar16)) {
      uVar8 = 0.0 < fVar16 | 2;
    }
  }
  else {
    if ((fVar15 != 0.0) || (NAN(fVar15))) goto LAB_001309a1;
    if ((((fVar12 != 0.0) || (NAN(fVar12))) || (fVar13 != 0.0)) || (NAN(fVar13))) {
      fVar17 = fVar19;
      uVar8 = 0.0 < fVar13 | 2;
      if (ABS(fVar13) < ABS(fVar12)) {
        uVar8 = (uint)(0.0 < fVar12);
      }
    }
    else {
      fVar17 = 0.0;
      uVar8 = (uint)(pIVar5->NavId <= (pIVar3->DC).LastItemId);
      fVar13 = 0.0;
      fVar12 = 0.0;
    }
  }
  uVar2 = pIVar5->NavMoveDir;
  fVar21 = result->DistBox;
  if (uVar8 == uVar2) {
    if (fVar18 < fVar21) {
      result->DistBox = fVar18;
      result->DistCenter = fVar19;
      return true;
    }
    if ((fVar18 == fVar21) && (!NAN(fVar18) && !NAN(fVar21))) {
      fVar18 = result->DistCenter;
      if (fVar19 < fVar18) {
        result->DistCenter = fVar19;
LAB_00130a4e:
        bVar6 = true;
        goto LAB_00130a54;
      }
      if ((fVar19 == fVar18) && (!NAN(fVar19) && !NAN(fVar18))) {
        if ((uVar8 & 2) == 0) {
          fVar16 = fVar15;
        }
        if (fVar16 < 0.0) goto LAB_00130a4e;
      }
    }
  }
  bVar6 = false;
LAB_00130a54:
  if (fVar21 != 3.4028235e+38) {
    return bVar6;
  }
  if (NAN(fVar21)) {
    return bVar6;
  }
  if (IVar1 != ImGuiNavLayer_Menu) {
    return bVar6;
  }
  if (fVar17 < result->DistAxial) {
    if ((pIVar4->Flags & 0x10000000) != 0) {
      return bVar6;
    }
    if (((0.0 <= fVar12 || uVar2 != 0) && (fVar12 <= 0.0 || uVar2 != 1)) &&
       ((uVar2 != 2 || (0.0 <= fVar13)))) {
      if (uVar2 != 3) {
        return bVar6;
      }
      if (fVar13 <= 0.0) {
        return bVar6;
      }
    }
    result->DistAxial = fVar17;
    return true;
  }
  return bVar6;
}

Assistant:

static bool NavScoreItem(ImGuiNavMoveResult* result, ImRect cand)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    const ImRect& curr = g.NavScoringRectScreen; // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Contains(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
       dbx = (dbx/1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (window->DC.LastItemId < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (ImGui::IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = ImGui::GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max-ImVec2(4,4), cand.Max+ImGui::CalcTextSize(buf)+ImVec2(4,4), IM_COL32(40,0,0,150));
        draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (ImGui::IsKeyPressedMap(ImGuiKey_C)) { g.NavMoveDirLast = (ImGuiDir)((g.NavMoveDirLast + 1) & 3); g.IO.KeysDownDuration[g.IO.KeyMap[ImGuiKey_C]] = 0.01f; }
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = ImGui::GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
 #endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    if (quadrant == g.NavMoveDir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == 1 && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((g.NavMoveDir == ImGuiDir_Left && dax < 0.0f) || (g.NavMoveDir == ImGuiDir_Right && dax > 0.0f) || (g.NavMoveDir == ImGuiDir_Up && day < 0.0f) || (g.NavMoveDir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}